

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTCue_GetProperties(FACTCue *pCue,FACTCueInstanceProperties **ppProperties)

{
  byte bVar1;
  FACTVariation *pFVar2;
  FACTSound *pFVar3;
  uint32_t uVar4;
  FACTCueInstanceProperties *pFVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  uint8_t *puVar10;
  FACTWaveInstanceProperties waveProps;
  FACTWaveInstanceProperties local_88;
  
  if (pCue != (FACTCue *)0x0) {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    if (pCue->playingSound == (FACTSoundInstance *)0x0) {
      sVar9 = 0x13c;
    }
    else {
      sVar9 = (ulong)pCue->playingSound->sound->trackCount * 0xc + 0x13c;
    }
    pFVar5 = (FACTCueInstanceProperties *)(*pCue->parentBank->parentEngine->pMalloc)(sVar9);
    SDL_memset(pFVar5,0,sVar9);
    FACTSoundBank_GetCueProperties(pCue->parentBank,pCue->index,&pFVar5->cueProperties);
    pFVar2 = pCue->playingVariation;
    if (pFVar2 != (FACTVariation *)0x0) {
      (pFVar5->activeVariationProperties).variationProperties.index = 0;
      uVar7._0_4_ = pFVar2->minWeight;
      uVar7._4_4_ = pFVar2->maxWeight;
      (pFVar5->activeVariationProperties).variationProperties.weight =
           (uint8_t)(int)((float)uVar7._4_4_ - (float)(undefined4)uVar7);
      uVar6 = (uint)(((pCue->field_7).variation)->flags == '\x03');
      uVar7 = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f) & uVar7;
      (pFVar5->activeVariationProperties).variationProperties.iaVariableMin = (float)(int)uVar7;
      (pFVar5->activeVariationProperties).variationProperties.iaVariableMax =
           (float)(int)(uVar7 >> 0x20);
      (pFVar5->activeVariationProperties).variationProperties.linger = pFVar2->linger;
    }
    if (pCue->playingSound != (FACTSoundInstance *)0x0) {
      pFVar3 = pCue->playingSound->sound;
      (pFVar5->activeVariationProperties).soundProperties.category = pFVar3->category;
      (pFVar5->activeVariationProperties).soundProperties.priority = pFVar3->priority;
      (pFVar5->activeVariationProperties).soundProperties.pitch = pFVar3->pitch;
      (pFVar5->activeVariationProperties).soundProperties.volume = pFVar3->volume;
      bVar1 = pFVar3->trackCount;
      (pFVar5->activeVariationProperties).soundProperties.numTracks = (ushort)bVar1;
      if (bVar1 != 0) {
        puVar10 = &(pFVar5->activeVariationProperties).soundProperties.arrTrackProperties[0].
                   loopCount;
        lVar8 = 0;
        uVar7 = 0;
        do {
          uVar4 = FACTWave_GetProperties
                            (*(FACTWave **)
                              ((long)&(pCue->playingSound->tracks->activeWave).wave + lVar8),
                             &local_88);
          if (uVar4 == 0) {
            ((FACTTrackProperties *)(puVar10 + -10))->duration =
                 (uint32_t)
                 (long)(((float)local_88.properties.durationInSamples /
                        (float)(local_88.properties.format.dwValue >> 5 & 0x3ffff)) / 1000.0);
            *(uint16_t *)(puVar10 + -6) = 1;
            puVar10[-4] = (byte)local_88.properties.format.dwValue >> 2 & 7;
            *(uint16_t *)(puVar10 + -2) = 0;
            *puVar10 = *(uint8_t *)
                        (*(long *)((long)&pCue->playingSound->tracks->waveEvt + lVar8) + 9);
          }
          uVar7 = uVar7 + 1;
          puVar10 = puVar10 + 0xc;
          lVar8 = lVar8 + 0x68;
        } while (uVar7 < (pFVar5->activeVariationProperties).soundProperties.numTracks);
      }
    }
    FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
    *ppProperties = pFVar5;
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTCue_GetProperties(
	FACTCue *pCue,
	FACTCueInstanceProperties **ppProperties
) {
	uint32_t i;
	size_t allocSize;
	FACTCueInstanceProperties *cueProps;
	FACTVariationProperties *varProps;
	FACTSoundProperties *sndProps;
	FACTWaveInstanceProperties waveProps;
	if (pCue == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* Alloc container (including variable length array space) */
	allocSize = sizeof(FACTCueInstanceProperties);
	if (pCue->playingSound != NULL)
	{
		allocSize += (
			sizeof(FACTTrackProperties) *
			pCue->playingSound->sound->trackCount
		);
	}
	cueProps = (FACTCueInstanceProperties*) pCue->parentBank->parentEngine->pMalloc(
		allocSize
	);
	FAudio_zero(cueProps, allocSize);

	/* Cue Properties */
	FACTSoundBank_GetCueProperties(
		pCue->parentBank,
		pCue->index,
		&cueProps->cueProperties
	);

	/* Variation Properties */
	varProps = &cueProps->activeVariationProperties.variationProperties;
	if (pCue->playingVariation != NULL)
	{
		varProps->index = 0; /* TODO: Index of what...? */
		/* TODO: This is just max - min right? Also why u8 wtf */
		varProps->weight = (uint8_t) (
			pCue->playingVariation->maxWeight -
			pCue->playingVariation->minWeight
		);
		if (pCue->variation->flags == 3)
		{
			varProps->iaVariableMin =
				pCue->playingVariation->minWeight;
			varProps->iaVariableMax =
				pCue->playingVariation->maxWeight;
		}
		else
		{
			varProps->iaVariableMin = 0;
			varProps->iaVariableMax = 0;
		}
		varProps->linger = pCue->playingVariation->linger;
	}

	/* Sound Properties */
	sndProps = &cueProps->activeVariationProperties.soundProperties;
	if (pCue->playingSound != NULL)
	{
		sndProps->category = pCue->playingSound->sound->category;
		sndProps->priority = pCue->playingSound->sound->priority;
		sndProps->pitch = pCue->playingSound->sound->pitch;
		sndProps->volume = pCue->playingSound->sound->volume;
		sndProps->numTracks = pCue->playingSound->sound->trackCount;

		for (i = 0; i < sndProps->numTracks; i += 1)
		{
			if (FACTWave_GetProperties(
				pCue->playingSound->tracks[i].activeWave.wave,
				&waveProps
			) == 0) {
				sndProps->arrTrackProperties[i].duration = (uint32_t) (
					(
						(float) waveProps.properties.durationInSamples /
						(float) waveProps.properties.format.nSamplesPerSec
					) / 1000.0f
				);
				sndProps->arrTrackProperties[i].numVariations = 1; /* ? */
				sndProps->arrTrackProperties[i].numChannels =
					waveProps.properties.format.nChannels;
				sndProps->arrTrackProperties[i].waveVariation = 0; /* ? */
				sndProps->arrTrackProperties[i].loopCount =
					pCue->playingSound->tracks[i].waveEvt->wave.loopCount;
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);

	*ppProperties = cueProps;
	return 0;
}